

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rect nk_pad_rect(nk_rect r,nk_vec2 pad)

{
  nk_rect nVar1;
  undefined4 local_38;
  undefined4 local_34;
  nk_vec2 pad_local;
  nk_rect r_local;
  
  r_local.w = r.w;
  pad_local.x = pad.x;
  if (pad_local.x * 2.0 <= r_local.w) {
    local_34 = r_local.w;
  }
  else {
    local_34 = pad_local.x * 2.0;
  }
  r_local.h = r.h;
  pad_local.y = pad.y;
  if (pad_local.y * 2.0 <= r_local.h) {
    local_38 = r_local.h;
  }
  else {
    local_38 = pad_local.y * 2.0;
  }
  r_local.x = r.x;
  r_local.y = r.y;
  nVar1.w = local_34 - (pad_local.x + pad_local.x);
  nVar1.h = local_38 - (pad_local.y + pad_local.y);
  nVar1.x = r_local.x + pad_local.x;
  nVar1.y = r_local.y + pad_local.y;
  return nVar1;
}

Assistant:

NK_LIB struct nk_rect
nk_pad_rect(struct nk_rect r, struct nk_vec2 pad)
{
r.w = NK_MAX(r.w, 2 * pad.x);
r.h = NK_MAX(r.h, 2 * pad.y);
r.x += pad.x; r.y += pad.y;
r.w -= 2 * pad.x;
r.h -= 2 * pad.y;
return r;
}